

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matte.cpp
# Opt level: O3

RGBColor __thiscall pm::Matte::globalShade(Matte *this,ShadeRecord *sr)

{
  float fVar1;
  World *pWVar2;
  _func_int **pp_Var3;
  long in_RDX;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  RGBColor RVar15;
  Vector3 sp;
  undefined1 local_48 [24];
  undefined1 local_30 [8];
  float local_28;
  
  (this->super_Material)._vptr_Material = (_func_int **)0x0;
  (this->super_Material).type_ = MATTE;
  if (*(int *)(in_RDX + 0x4c) == 0) {
    (**(code **)(*(long *)sr + 0x18))(local_48,sr);
    (this->super_Material)._vptr_Material = (_func_int **)local_48._0_8_;
    (this->super_Material).type_ = local_48._8_4_;
  }
  fVar1 = *(float *)(in_RDX + 0x30);
  fVar10 = (float)*(undefined8 *)(in_RDX + 0x28);
  fVar11 = (float)((ulong)*(undefined8 *)(in_RDX + 0x28) >> 0x20);
  fVar12 = fVar1 - fVar11 * 0.0071;
  fVar13 = fVar10 * 0.0071 + fVar1 * -0.0034;
  fVar14 = fVar11 * 0.0034 - fVar10;
  fVar6 = SQRT(fVar14 * fVar14 + fVar12 * fVar12 + fVar13 * fVar13);
  fVar12 = fVar12 / fVar6;
  fVar13 = fVar13 / fVar6;
  fVar14 = fVar14 / fVar6;
  SamplerState::sampleHemisphere((SamplerState *)local_48);
  fVar6 = (float)local_48._0_8_;
  fVar9 = SUB84(local_48._0_8_,4);
  auVar4._0_4_ = (float)local_48._8_4_ * fVar10 +
                 (fVar13 * fVar1 - fVar11 * fVar14) * fVar6 + fVar12 * fVar9;
  auVar4._4_4_ = (float)local_48._8_4_ * fVar11 +
                 fVar13 * fVar9 + (fVar14 * fVar10 - fVar1 * fVar12) * fVar6;
  auVar4._8_4_ = (float)local_48._8_4_ * 0.0 + 0.0;
  auVar4._12_4_ = (float)local_48._8_4_ * 0.0 + 0.0;
  local_48._20_4_ =
       fVar1 * (float)local_48._8_4_ + fVar14 * fVar9 + (fVar12 * fVar11 - fVar10 * fVar13) * fVar6;
  auVar7._0_4_ = SQRT((float)local_48._20_4_ * (float)local_48._20_4_ +
                      auVar4._0_4_ * auVar4._0_4_ + auVar4._4_4_ * auVar4._4_4_);
  local_48._20_4_ = (float)local_48._20_4_ / auVar7._0_4_;
  auVar7._4_4_ = auVar7._0_4_;
  auVar7._8_4_ = auVar7._0_4_;
  auVar7._12_4_ = auVar7._0_4_;
  auVar4 = divps(auVar4,auVar7);
  local_48._12_8_ = auVar4._0_8_;
  fVar10 = *(float *)(in_RDX + 0x30) * (float)local_48._20_4_ +
           *(float *)(in_RDX + 0x28) * auVar4._0_4_ + auVar4._4_4_ * *(float *)(in_RDX + 0x2c);
  fVar9 = fVar10 * 0.31830987;
  fVar1 = *(float *)((long)&sr->tracer + 4);
  fVar6 = *(float *)&sr->tracer;
  local_48._0_8_ = *(unsigned_long *)(in_RDX + 0x10);
  local_48._8_4_ = *(int *)(in_RDX + 0x18);
  pWVar2 = sr->world;
  fVar11 = SUB84(pWVar2,0);
  (**(code **)(**(long **)(in_RDX + 0x68) + 0x18))
            (local_30,*(long **)(in_RDX + 0x68),*(undefined8 *)(in_RDX + 0x60),local_48,
             *(int *)(in_RDX + 0x4c) + 1);
  auVar8._0_4_ = fVar10 * local_30._0_4_ * fVar11 * (float)((ulong)pWVar2 >> 0x20) * 0.31830987;
  auVar8._4_4_ = fVar10 * local_30._4_4_ * fVar6 * fVar11 * 0.31830987;
  auVar8._8_8_ = 0;
  auVar5._4_4_ = fVar9;
  auVar5._0_4_ = fVar9;
  auVar5._8_8_ = 0;
  auVar4 = divps(auVar8,auVar5);
  pp_Var3 = (this->super_Material)._vptr_Material;
  RVar15.b = auVar4._0_4_;
  RVar15._0_8_ = (_func_int **)
                 CONCAT44((float)((ulong)pp_Var3 >> 0x20) + auVar4._4_4_,SUB84(pp_Var3,0) + RVar15.b
                         );
  (this->super_Material)._vptr_Material = RVar15._0_8_;
  (this->super_Material).type_ =
       (Type)((fVar1 * fVar11 * 0.31830987 * local_28 * fVar10) / fVar9 +
             (float)(this->super_Material).type_);
  return RVar15;
}

Assistant:

RGBColor Matte::globalShade(ShadeRecord &sr) const
{
	RGBColor L;

	if (sr.depth == 0)
		L = areaLightShade(sr);

	Vector3 wi;
	const Vector3 wo = -sr.ray.d;
	float pdf = 0.0f;
	const RGBColor f = diffuseBrdf_.sampleF(sr, wo, wi, pdf);
	const float nDotWi = dot(sr.normal, wi);
	const Ray reflectedRay(sr.hitPoint, wi);

	L += f * sr.tracer.traceRay(sr.world, reflectedRay, sr.depth + 1) * nDotWi / pdf;

	return L;
}